

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorSelfReferencingUnits2_Test::~Units_scalingFactorSelfReferencingUnits2_Test
          (Units_scalingFactorSelfReferencingUnits2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorSelfReferencingUnits2)
{
    auto model = libcellml::Model::create();
    auto X = libcellml::Units::create("X");
    X->addUnit("mole");
    auto mX = libcellml::Units::create("mX");
    mX->addUnit("X", "milli");
    model->addUnits(X);
    model->addUnits(mX);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));

    X->addUnit("litre", -3.0);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));
}